

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::Oops(B3DImporter *this)

{
  DeadlyImportError *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"B3D Importer - INTERNAL ERROR",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void B3DImporter::Oops(){
    throw DeadlyImportError( "B3D Importer - INTERNAL ERROR" );
}